

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

DdNode * cuddBddIteRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *local_d0;
  uint local_c4;
  bool local_b5;
  uint local_b4;
  DdHalfWord local_ac;
  int comple;
  int index;
  uint v;
  uint toph;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *Hnv;
  DdNode *Hv;
  DdNode *H;
  DdNode *Gnv;
  DdNode *Gv;
  DdNode *Fnv;
  DdNode *Fv;
  DdNode *r;
  DdNode *res;
  DdNode *zero;
  DdNode *one;
  DdNode *h_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  local_ac = 0xffffffff;
  zero = dd->one;
  dd_local = (DdManager *)g;
  if ((f != zero) && (res = (DdNode *)((ulong)zero ^ 1), dd_local = (DdManager *)h, f != res)) {
    one = h;
    h_local = g;
    g_local = f;
    f_local = &dd->sentinel;
    if ((g == zero) || (f == g)) {
      dd_local = (DdManager *)f;
      if (h != res) {
        pDVar2 = cuddBddAndRecur(dd,(DdNode *)((ulong)f ^ 1),(DdNode *)((ulong)h ^ 1));
        dd_local = (DdManager *)((ulong)pDVar2 ^ (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
      }
    }
    else if ((g == res) || (f == (DdNode *)((ulong)g ^ 1))) {
      if (h == zero) {
        dd_local = (DdManager *)((ulong)f ^ 1);
      }
      else {
        dd_local = (DdManager *)cuddBddAndRecur(dd,(DdNode *)((ulong)f ^ 1),h);
      }
    }
    else if ((h == res) || (f == h)) {
      dd_local = (DdManager *)cuddBddAndRecur(dd,f,g);
    }
    else if ((h == zero) || (f == (DdNode *)((ulong)h ^ 1))) {
      pDVar2 = cuddBddAndRecur(dd,f,(DdNode *)((ulong)g ^ 1));
      dd_local = (DdManager *)((ulong)pDVar2 ^ (long)(int)(uint)(pDVar2 != (DdNode *)0x0));
    }
    else {
      dd_local = (DdManager *)g;
      if (g != h) {
        if (g == (DdNode *)((ulong)h ^ 1)) {
          dd_local = (DdManager *)cuddBddXorRecur(dd,f,h);
        }
        else {
          iVar1 = bddVarToCanonicalSimple(dd,&g_local,&h_local,&one,&toph,&v,(uint *)&index);
          if ((uint)index < v) {
            local_b4 = index;
          }
          else {
            local_b4 = v;
          }
          comple = local_b4;
          if (((toph < local_b4) && ((g_local->type).kids.T == zero)) &&
             ((g_local->type).kids.E == res)) {
            pDVar2 = cuddUniqueInter((DdManager *)f_local,g_local->index,h_local,one);
            local_b5 = iVar1 != 0 && pDVar2 != (DdNode *)0x0;
            dd_local = (DdManager *)((ulong)pDVar2 ^ (long)(int)(uint)local_b5);
          }
          else {
            Fv = cuddCacheLookup((DdManager *)f_local,0xe,g_local,h_local,one);
            if (Fv == (DdNode *)0x0) {
              if (local_b4 < toph) {
                Gv = g_local;
                Fnv = g_local;
              }
              else {
                if (local_b4 < toph) {
                  local_c4 = local_b4;
                }
                else {
                  local_c4 = toph;
                }
                comple = local_c4;
                local_ac = g_local->index;
                Fnv = (g_local->type).kids.T;
                Gv = (g_local->type).kids.E;
              }
              if (v == comple) {
                local_ac = h_local->index;
                Gnv = (h_local->type).kids.T;
                H = (h_local->type).kids.E;
              }
              else {
                H = h_local;
                Gnv = h_local;
              }
              if (index == comple) {
                Hv = (DdNode *)((ulong)one & 0xfffffffffffffffe);
                local_ac = Hv->index;
                Hnv = (Hv->type).kids.T;
                t = (Hv->type).kids.E;
                if (((ulong)one & 1) != 0) {
                  Hnv = (DdNode *)((ulong)Hnv ^ 1);
                  t = (DdNode *)((ulong)t ^ 1);
                }
              }
              else {
                t = one;
                Hnv = one;
              }
              e = cuddBddIteRecur((DdManager *)f_local,Fnv,Gnv,Hnv);
              if (e == (DdNode *)0x0) {
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + 1;
                _topg = cuddBddIteRecur((DdManager *)f_local,Gv,H,t);
                if (_topg == (DdNode *)0x0) {
                  Cudd_IterDerefBdd((DdManager *)f_local,e);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)_topg & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)_topg & 0xfffffffffffffffe) + 4) + 1;
                  if (e == _topg) {
                    local_d0 = e;
                  }
                  else {
                    local_d0 = cuddUniqueInter((DdManager *)f_local,local_ac,e,_topg);
                  }
                  Fv = local_d0;
                  if (local_d0 == (DdNode *)0x0) {
                    Cudd_IterDerefBdd((DdManager *)f_local,e);
                    Cudd_IterDerefBdd((DdManager *)f_local,_topg);
                    dd_local = (DdManager *)0x0;
                  }
                  else {
                    *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)e & 0xfffffffffffffffe) + 4) + -1;
                    *(int *)(((ulong)_topg & 0xfffffffffffffffe) + 4) =
                         *(int *)(((ulong)_topg & 0xfffffffffffffffe) + 4) + -1;
                    cuddCacheInsert((DdManager *)f_local,0xe,g_local,h_local,one,local_d0);
                    dd_local = (DdManager *)((ulong)Fv ^ (long)iVar1);
                  }
                }
              }
            }
            else {
              dd_local = (DdManager *)((ulong)Fv ^ (long)iVar1);
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddBddIteRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode       *one, *zero, *res;
    DdNode       *r, *Fv, *Fnv, *Gv, *Gnv, *H, *Hv, *Hnv, *t, *e;
    unsigned int topf, topg, toph, v;
    int          index = -1;
    int          comple;

    statLine(dd);
    /* Terminal cases. */

    /* One variable cases. */
    if (f == (one = DD_ONE(dd)))        /* ITE(1,G,H) = G */
        return(g);
    
    if (f == (zero = Cudd_Not(one)))    /* ITE(0,G,H) = H */
        return(h);
    
    /* From now on, f is known not to be a constant. */
    if (g == one || f == g) {   /* ITE(F,F,H) = ITE(F,1,H) = F + H */
        if (h == zero) {        /* ITE(F,1,0) = F */
            return(f);
        } else {
            res = cuddBddAndRecur(dd,Cudd_Not(f),Cudd_Not(h));
            return(Cudd_NotCond(res,res != NULL));
        }
    } else if (g == zero || f == Cudd_Not(g)) { /* ITE(F,!F,H) = ITE(F,0,H) = !F * H */
        if (h == one) {         /* ITE(F,0,1) = !F */
            return(Cudd_Not(f));
        } else {
            res = cuddBddAndRecur(dd,Cudd_Not(f),h);
            return(res);
        }
    }
    if (h == zero || f == h) {    /* ITE(F,G,F) = ITE(F,G,0) = F * G */
        res = cuddBddAndRecur(dd,f,g);
        return(res);
    } else if (h == one || f == Cudd_Not(h)) { /* ITE(F,G,!F) = ITE(F,G,1) = !F + G */
        res = cuddBddAndRecur(dd,f,Cudd_Not(g));
        return(Cudd_NotCond(res,res != NULL));
    }

    /* Check remaining one variable case. */
    if (g == h) {               /* ITE(F,G,G) = G */
        return(g);
    } else if (g == Cudd_Not(h)) { /* ITE(F,G,!G) = F <-> G */
        res = cuddBddXorRecur(dd,f,h);
        return(res);
    }
    
    /* From here, there are no constants. */
    comple = bddVarToCanonicalSimple(dd, &f, &g, &h, &topf, &topg, &toph);

    /* f & g are now regular pointers */

    v = ddMin(topg, toph);

    /* A shortcut: ITE(F,G,H) = (v,G,H) if F = (v,1,0), v < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        r = cuddUniqueInter(dd, (int) f->index, g, h);
        return(Cudd_NotCond(r,comple && r != NULL));
    }

    /* Check cache. */
    r = cuddCacheLookup(dd, DD_BDD_ITE_TAG, f, g, h);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf, v);     /* v = top_var(F,G,H) */
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        index = g->index;
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        H = Cudd_Regular(h);
        index = H->index;
        Hv = cuddT(H); Hnv = cuddE(H);
        if (Cudd_IsComplement(h)) {
            Hv = Cudd_Not(Hv);
            Hnv = Cudd_Not(Hnv);
        }
    } else {
        Hv = Hnv = h;
    }

    /* Recursive step. */
    t = cuddBddIteRecur(dd,Fv,Gv,Hv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddIteRecur(dd,Fnv,Gnv,Hnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(dd,t);
        return(NULL);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
    if (r == NULL) {
        Cudd_IterDerefBdd(dd,t);
        Cudd_IterDerefBdd(dd,e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert(dd, DD_BDD_ITE_TAG, f, g, h, r);
    return(Cudd_NotCond(r,comple));

}